

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O2

int RSA_decrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  _func_int_RSA_ptr_size_t_ptr_uint8_t_ptr_size_t_uint8_t_ptr_size_t_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  byte *out_00;
  ulong uVar3;
  ulong uVar4;
  int line;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  size_t __n;
  
  UNRECOVERED_JUMPTABLE = rsa->meth->decrypt;
  if (UNRECOVERED_JUMPTABLE !=
      (_func_int_RSA_ptr_size_t_ptr_uint8_t_ptr_size_t_uint8_t_ptr_size_t_int *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(rsa,out_len,out,max_out,in,in_len,padding);
    return iVar1;
  }
  uVar2 = RSA_size((RSA *)rsa);
  uVar3 = (ulong)uVar2;
  if (max_out < uVar3) {
    ERR_put_error(4,0,0x87,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x1af);
    return 0;
  }
  out_00 = out;
  if ((padding != 3) && (out_00 = (byte *)OPENSSL_malloc(uVar3), out_00 == (byte *)0x0)) {
    iVar1 = 0;
    out_00 = (byte *)0x0;
    goto LAB_00195858;
  }
  if (uVar3 == in_len) {
    iVar1 = rsa_private_transform(rsa,out_00,in,in_len);
    if (iVar1 != 0) {
      if (padding == 4) {
        iVar1 = RSA_padding_check_PKCS1_OAEP_mgf1
                          (out,out_len,in_len,out_00,in_len,(uint8_t *)0x0,0,(EVP_MD *)0x0,
                           (EVP_MD *)0x0);
        if (iVar1 != 0) {
          iVar1 = 1;
          goto LAB_00195858;
        }
      }
      else {
        if (padding == 3) {
          *out_len = in_len;
          return 1;
        }
        if (padding != 1) {
          iVar1 = 0;
          ERR_put_error(4,0,0x8f,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                        ,0x1d5);
          goto LAB_00195858;
        }
        if (uVar3 == 0) {
          iVar1 = 0x78;
          line = 0xf7;
        }
        else if (uVar2 < 0xb) {
          iVar1 = 0x7e;
          line = 0x100;
        }
        else {
          uVar3 = 0xffffffffffffffff;
          uVar4 = 0;
          for (uVar6 = 2; in_len != uVar6; uVar6 = uVar6 + 1) {
            uVar5 = (long)((ulong)out_00[uVar6] - 1) >> 0x3f;
            uVar4 = uVar4 ^ (uVar6 ^ uVar4) & uVar5 & uVar3;
            uVar3 = uVar3 & ~uVar5;
          }
          if ((((long)(9 - uVar4 | uVar4) < 0) &&
              ((long)(((ulong)out_00[1] ^ 2) - 1 & (ulong)*out_00 - 1) < 0)) &&
             (uVar3 != 0xffffffffffffffff)) {
            uVar4 = uVar4 + 1;
            __n = in_len - uVar4;
            if (uVar4 <= in_len) {
              if (__n != 0) {
                memcpy(out,out_00 + uVar4,__n);
              }
              *out_len = __n;
              iVar1 = 1;
              goto LAB_00195852;
            }
            iVar1 = 0x89;
            line = 0x12d;
          }
          else {
            iVar1 = 0x89;
            line = 0x125;
          }
        }
        ERR_put_error(4,0,iVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                      ,line);
      }
      ERR_put_error(4,0,0x88,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0x1db);
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    ERR_put_error(4,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x1be);
  }
LAB_00195852:
  if (padding == 3) {
    return iVar1;
  }
LAB_00195858:
  OPENSSL_free(out_00);
  return iVar1;
}

Assistant:

int RSA_decrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->meth->decrypt) {
    return rsa->meth->decrypt(rsa, out_len, out, max_out, in, in_len, padding);
  }

  return rsa_default_decrypt(rsa, out_len, out, max_out, in, in_len, padding);
}